

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-default-aes-impl.c
# Opt level: O1

int ndn_lite_default_aes_cbc_encrypt
              (uint8_t *input_value,uint32_t input_size,uint8_t *output_value,uint32_t *output_size,
              uint8_t *aes_iv,abstract_aes_key *aes_key)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  size_t __n;
  uint8_t *puVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  uint uVar7;
  uint8_t *in;
  uint uVar8;
  uint8_t *out;
  uint8_t auStack_110 [8];
  undefined1 local_108 [8];
  tc_aes_key_sched_struct schedule;
  
  schedule.words._168_8_ = local_108;
  if (aes_key->key_size < 0x10) {
    return -0x1b;
  }
  lVar2 = -((ulong)(input_size + 0x10) + 0xf & 0xfffffffffffffff0);
  in = local_108 + lVar2;
  uVar8 = input_size & 0xff;
  uVar7 = input_size & 0xf;
  if (uVar7 == 0) {
    puVar6 = auStack_110 + lVar2;
    schedule.words._168_8_ = local_108;
    builtin_memcpy(auStack_110 + lVar2,"Zt\x11",4);
    puVar6[4] = '\0';
    puVar6[5] = '\0';
    puVar6[6] = '\0';
    puVar6[7] = '\0';
    memcpy(in,input_value,(ulong)(input_size & 0xf0));
  }
  else {
    uVar8 = uVar8 + (0x10 - uVar7);
    __n = 0xfffffff6;
    if ((input_size + 0x10 & 0xff) < uVar8) goto LAB_00117460;
    puVar4 = auStack_110 + lVar2;
    schedule.words._168_8_ = local_108;
    builtin_memcpy(auStack_110 + lVar2,"\x1ft\x11",4);
    puVar4[4] = '\0';
    puVar4[5] = '\0';
    puVar4[6] = '\0';
    puVar4[7] = '\0';
    memcpy(in,input_value,(ulong)(input_size & 0xff));
    bVar1 = "\x01\x02\x03\x04\x05\x06\a\b\t\n\v\f\r\x0e\x0f\x10"[(ulong)uVar7 ^ 0xf];
    puVar5 = auStack_110 + lVar2;
    builtin_memcpy(auStack_110 + lVar2,"?t\x11",4);
    puVar5[4] = '\0';
    puVar5[5] = '\0';
    puVar5[6] = '\0';
    puVar5[7] = '\0';
    memset(in + (input_size & 0xff),(uint)bVar1,(ulong)(0x10 - uVar7));
  }
  __n = (size_t)uVar8;
LAB_00117460:
  uVar8 = (uint)__n;
  uVar7 = uVar8;
  if (-1 < (int)uVar8) {
    out = in + -(__n + 0x1f & 0xfffffffffffffff0);
    out[-8] = 0x87;
    out[-7] = 't';
    out[-6] = '\x11';
    out[-5] = '\0';
    out[-4] = '\0';
    out[-3] = '\0';
    out[-2] = '\0';
    out[-1] = '\0';
    iVar3 = tc_aes128_set_encrypt_key((TCAesKeySched_t)local_108,aes_key->key_value);
    uVar7 = 0xffffffe4;
    if (iVar3 == 1) {
      out[-8] = 0xac;
      out[-7] = 't';
      out[-6] = '\x11';
      out[-5] = '\0';
      out[-4] = '\0';
      out[-3] = '\0';
      out[-2] = '\0';
      out[-1] = '\0';
      iVar3 = tc_cbc_mode_encrypt(out,uVar8 + 0x10,in,uVar8,aes_iv,(TCAesKeySched_t)local_108);
      uVar7 = 0xffffffe7;
      if (iVar3 == 1) {
        out[-8] = 0xc9;
        out[-7] = 't';
        out[-6] = '\x11';
        out[-5] = '\0';
        out[-4] = '\0';
        out[-3] = '\0';
        out[-2] = '\0';
        out[-1] = '\0';
        memcpy(output_value,out + 0x10,__n);
        *output_size = uVar8;
        uVar7 = 0;
      }
    }
  }
  return uVar7;
}

Assistant:

int
ndn_lite_default_aes_cbc_encrypt(const uint8_t* input_value, uint32_t input_size,
                                 uint8_t* output_value, uint32_t* output_size,
                                 const uint8_t* aes_iv, const struct abstract_aes_key* aes_key)
{
  if (aes_key->key_size < NDN_SEC_AES_MIN_KEY_SIZE) {
    return NDN_SEC_WRONG_AES_SIZE;
  }
  // TODO: too much memory usage when encrypt large chunks
  uint8_t final_input[input_size + TC_AES_BLOCK_SIZE];
  int err_or_size = _pkcs7_padding(input_value, input_size, final_input, sizeof(final_input));
  if (err_or_size < 0)
    return err_or_size;
  uint8_t output[err_or_size + TC_AES_BLOCK_SIZE];
  struct tc_aes_key_sched_struct schedule;
  if (tc_aes128_set_encrypt_key(&schedule, aes_key->key_value) != TC_CRYPTO_SUCCESS) {
    return NDN_SEC_INIT_FAILURE;
  }
  // Tinycrypt will prepend IV to the output
  if (tc_cbc_mode_encrypt(output, err_or_size + TC_AES_BLOCK_SIZE,
                          final_input, err_or_size, aes_iv, &schedule) != TC_CRYPTO_SUCCESS) {
    return NDN_SEC_CRYPTO_ALGO_FAILURE;
  }
  memcpy(output_value, output + TC_AES_BLOCK_SIZE, err_or_size);
  *output_size = err_or_size;
  return NDN_SUCCESS;
}